

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

Roaring64Map * __thiscall
roaring::Roaring64Map::operator-
          (Roaring64Map *__return_storage_ptr__,Roaring64Map *this,Roaring64Map *o)

{
  Roaring64Map *r;
  Roaring64Map local_50;
  
  Roaring64Map(&local_50,this);
  r = operator-=(&local_50,o);
  Roaring64Map(__return_storage_ptr__,r);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

Roaring64Map operator-(const Roaring64Map &o) const {
        return Roaring64Map(*this) -= o;
    }